

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O1

void __thiscall xLearn::Score::~Score(Score *this)

{
  pointer pcVar1;
  
  this->_vptr_Score = (_func_int **)&PTR__Score_001b5328;
  pcVar1 = (this->opt_type_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->opt_type_).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

virtual ~Score() { }